

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_transaction.hpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_>::
transaction_contents
          (transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this,
          not_null<context_*> ctxt,not_null<string_mapping_*> names,not_null<string_mapping_*> paths
          )

{
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__transaction_contents_0015af90;
  begin(&this->transaction_,((ctxt.ptr_)->db).ptr_);
  (this->names_).ptr_ = names.ptr_;
  (this->paths_).ptr_ = paths.ptr_;
  return;
}

Assistant:

transaction_contents (not_null<context *> const ctxt,
                                      not_null<string_mapping *> const names,
                                      not_null<string_mapping *> const paths)
                        : rule (ctxt)
                        , transaction_{begin (*ctxt->db)}
                        , names_{names}
                        , paths_{paths} {}